

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererParallelTests.cpp
# Opt level: O0

void __thiscall
agge::tests::RendererParallelTests::RowsAreProcessedInInterlacedOrderInDedicatedThreads
          (RendererParallelTests *this)

{
  cell *pcVar1;
  cell *pcVar2;
  allocator local_741;
  string local_740 [32];
  LocationInfo local_720;
  int local_6f4;
  int local_6f0;
  allocator local_6e9;
  string local_6e8 [32];
  LocationInfo local_6c8;
  int local_69c;
  int local_698;
  simple_alpha<unsigned_char,_8UL> local_692;
  zero local_691;
  agge_vector<int> local_690;
  undefined1 local_688 [8];
  renderer_parallel r3;
  string local_650 [32];
  LocationInfo local_630;
  int local_604;
  int local_600;
  allocator local_5f9;
  string local_5f8 [32];
  LocationInfo local_5d8;
  int local_5ac;
  int local_5a8;
  allocator local_5a1;
  string local_5a0 [32];
  LocationInfo local_580;
  int local_554;
  int local_550;
  allocator local_549;
  string local_548 [32];
  LocationInfo local_528;
  int local_4fc;
  int local_4f8;
  allocator local_4f1;
  string local_4f0 [32];
  LocationInfo local_4d0;
  int local_4a4;
  int local_4a0;
  allocator local_499;
  string local_498 [32];
  LocationInfo local_478;
  int local_44c;
  int local_448;
  simple_alpha<unsigned_char,_8UL> local_442;
  zero local_441;
  agge_vector<int> local_440;
  undefined1 local_438 [8];
  renderer_parallel r2;
  string local_400 [32];
  LocationInfo local_3e0;
  int local_3b4;
  int local_3b0;
  allocator local_3a9;
  string local_3a8 [32];
  LocationInfo local_388;
  int local_35c;
  int local_358;
  allocator local_351;
  string local_350 [32];
  LocationInfo local_330;
  int local_304;
  int local_300;
  allocator local_2f9;
  string local_2f8 [32];
  LocationInfo local_2d8;
  int local_2ac;
  int local_2a8;
  allocator local_2a1;
  string local_2a0 [32];
  LocationInfo local_280;
  int local_254;
  int local_250;
  simple_alpha<unsigned_char,_8UL> local_24a;
  zero local_249;
  agge_vector<int> local_248;
  undefined1 local_240 [8];
  renderer_parallel r1;
  thread_mapping_blender<unsigned_short,_unsigned_char> blender;
  mutex mtx;
  thread_mapping mapping;
  undefined1 local_170 [8];
  bitmap<unsigned_short,_0UL,_0UL> bitmap;
  mask_full<8UL> mask;
  scanline_cells cells [6];
  cell cells6 [2];
  undefined1 auStack_a8 [8];
  cell cells5 [2];
  undefined1 auStack_88 [8];
  cell cells4 [2];
  undefined1 auStack_68 [8];
  cell cells3 [2];
  undefined1 auStack_48 [8];
  cell cells2 [2];
  undefined1 auStack_28 [8];
  cell cells1 [2];
  RendererParallelTests *this_local;
  
  cells1[0].cover = 0;
  cells1[1].x = -0x10;
  auStack_28._0_4_ = 0;
  auStack_28._4_4_ = 0;
  cells1[0].x = 0x10;
  cells1[0].area = 3;
  cells2[0].cover = 0;
  cells2[1].x = -0x10;
  auStack_48._0_4_ = 1;
  auStack_48._4_4_ = 0;
  cells2[0].x = 0x10;
  cells2[0].area = 4;
  cells3[0].cover = 0;
  cells3[1].x = -0x10;
  auStack_68._0_4_ = 2;
  auStack_68._4_4_ = 0;
  cells3[0].x = 0x10;
  cells3[0].area = 5;
  cells4[0].cover = 0;
  cells4[1].x = -0x10;
  auStack_88._0_4_ = 1;
  auStack_88._4_4_ = 0;
  cells4[0].x = 0x10;
  cells4[0].area = 4;
  cells5[0].cover = 0;
  cells5[1].x = -0x10;
  auStack_a8._0_4_ = 0;
  auStack_a8._4_4_ = 0;
  cells5[0].x = 0x10;
  cells5[0].area = 3;
  cells[5].second = (cell *)0x1;
  cells1[1]._4_8_ = this;
  pcVar1 = begin<agge::tests::mocks::cell_const,2ul>((cell (*) [2])auStack_28);
  pcVar2 = end<agge::tests::mocks::cell_const,2ul>((cell (*) [2])auStack_28);
  join_0x00000010_0x00000000_ =
       std::make_pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>
                 (pcVar1,pcVar2);
  pcVar1 = begin<agge::tests::mocks::cell_const,2ul>((cell (*) [2])auStack_48);
  pcVar2 = end<agge::tests::mocks::cell_const,2ul>((cell (*) [2])auStack_48);
  cells._8_16_ = (undefined1  [16])
                 std::make_pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>
                           (pcVar1,pcVar2);
  pcVar1 = begin<agge::tests::mocks::cell_const,2ul>((cell (*) [2])auStack_68);
  pcVar2 = end<agge::tests::mocks::cell_const,2ul>((cell (*) [2])auStack_68);
  cells._24_16_ =
       (undefined1  [16])
       std::make_pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>
                 (pcVar1,pcVar2);
  pcVar1 = begin<agge::tests::mocks::cell_const,2ul>((cell (*) [2])auStack_88);
  pcVar2 = end<agge::tests::mocks::cell_const,2ul>((cell (*) [2])auStack_88);
  cells._40_16_ =
       (undefined1  [16])
       std::make_pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>
                 (pcVar1,pcVar2);
  pcVar1 = begin<agge::tests::mocks::cell_const,2ul>((cell (*) [2])auStack_a8);
  pcVar2 = end<agge::tests::mocks::cell_const,2ul>((cell (*) [2])auStack_a8);
  cells._56_16_ =
       (undefined1  [16])
       std::make_pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>
                 (pcVar1,pcVar2);
  pcVar1 = begin<agge::tests::mocks::cell_const,2ul>((cell (*) [2])&cells[5].second);
  pcVar2 = end<agge::tests::mocks::cell_const,2ul>((cell (*) [2])&cells[5].second);
  cells._72_16_ =
       (undefined1  [16])
       std::make_pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>
                 (pcVar1,pcVar2);
  tests::mocks::mask_full<8ul>::
  mask_full<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,6>
            ((mask_full<8ul> *)&bitmap._width,
             (pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*) [6])
             &mask.super_mask<8UL>._cells.
              super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  tests::mocks::bitmap<unsigned_short,_0UL,_0UL>::bitmap
            ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,5,6);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(mtx._buffer + 0x5c));
  mutex::mutex((mutex *)((long)&blender._mtx + 4));
  tests::mocks::thread_mapping_blender<unsigned_short,_unsigned_char>::thread_mapping_blender
            ((thread_mapping_blender<unsigned_short,_unsigned_char> *)&r1._parallelism,
             (thread_mapping *)(mtx._buffer + 0x5c),(mutex *)((long)&blender._mtx + 4));
  renderer_parallel::renderer_parallel((renderer_parallel *)local_240,2);
  local_248 = zero::operator_cast_to_agge_vector(&local_249);
  renderer_parallel::operator()
            ((renderer_parallel *)local_240,(bitmap<unsigned_short,_0UL,_0UL> *)local_170,local_248,
             (rect_i *)0x0,(mask_full<8UL> *)&bitmap._width,
             (thread_mapping_blender<unsigned_short,_unsigned_char> *)&r1._parallelism,&local_24a);
  local_250 = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,0);
  local_254 = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2a0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,&local_2a1);
  ut::LocationInfo::LocationInfo(&local_280,(string *)local_2a0,0x97);
  ut::are_equal<int,int>(&local_250,&local_254,&local_280);
  ut::LocationInfo::~LocationInfo(&local_280);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  local_2a8 = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,0);
  local_2ac = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2f8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,&local_2f9);
  ut::LocationInfo::LocationInfo(&local_2d8,(string *)local_2f8,0x98);
  ut::are_equal<int,int>(&local_2a8,&local_2ac,&local_2d8);
  ut::LocationInfo::~LocationInfo(&local_2d8);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  local_300 = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,0);
  local_304 = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_350,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,&local_351);
  ut::LocationInfo::LocationInfo(&local_330,(string *)local_350,0x9a);
  ut::are_not_equal<int,int>(&local_300,&local_304,&local_330);
  ut::LocationInfo::~LocationInfo(&local_330);
  std::__cxx11::string::~string(local_350);
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  local_358 = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,1);
  local_35c = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_3a8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,&local_3a9);
  ut::LocationInfo::LocationInfo(&local_388,(string *)local_3a8,0x9b);
  ut::are_equal<int,int>(&local_358,&local_35c,&local_388);
  ut::LocationInfo::~LocationInfo(&local_388);
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  local_3b0 = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,1);
  local_3b4 = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_400,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,(allocator *)&r2.field_0x2f);
  ut::LocationInfo::LocationInfo(&local_3e0,(string *)local_400,0x9c);
  ut::are_equal<int,int>(&local_3b0,&local_3b4,&local_3e0);
  ut::LocationInfo::~LocationInfo(&local_3e0);
  std::__cxx11::string::~string(local_400);
  std::allocator<char>::~allocator((allocator<char> *)&r2.field_0x2f);
  renderer_parallel::renderer_parallel((renderer_parallel *)local_438,3);
  local_440 = zero::operator_cast_to_agge_vector(&local_441);
  renderer_parallel::operator()
            ((renderer_parallel *)local_438,(bitmap<unsigned_short,_0UL,_0UL> *)local_170,local_440,
             (rect_i *)0x0,(mask_full<8UL> *)&bitmap._width,
             (thread_mapping_blender<unsigned_short,_unsigned_char> *)&r1._parallelism,&local_442);
  local_448 = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,0);
  local_44c = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_498,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,&local_499);
  ut::LocationInfo::LocationInfo(&local_478,(string *)local_498,0xa3);
  ut::are_equal<int,int>(&local_448,&local_44c,&local_478);
  ut::LocationInfo::~LocationInfo(&local_478);
  std::__cxx11::string::~string(local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  local_4a0 = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,0);
  local_4a4 = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_4f0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,&local_4f1);
  ut::LocationInfo::LocationInfo(&local_4d0,(string *)local_4f0,0xa5);
  ut::are_not_equal<int,int>(&local_4a0,&local_4a4,&local_4d0);
  ut::LocationInfo::~LocationInfo(&local_4d0);
  std::__cxx11::string::~string(local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  local_4f8 = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,1);
  local_4fc = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_548,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,&local_549);
  ut::LocationInfo::LocationInfo(&local_528,(string *)local_548,0xa6);
  ut::are_equal<int,int>(&local_4f8,&local_4fc,&local_528);
  ut::LocationInfo::~LocationInfo(&local_528);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator((allocator<char> *)&local_549);
  local_550 = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,0);
  local_554 = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_5a0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,&local_5a1);
  ut::LocationInfo::LocationInfo(&local_580,(string *)local_5a0,0xa8);
  ut::are_not_equal<int,int>(&local_550,&local_554,&local_580);
  ut::LocationInfo::~LocationInfo(&local_580);
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
  local_5a8 = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,1);
  local_5ac = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_5f8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,&local_5f9);
  ut::LocationInfo::LocationInfo(&local_5d8,(string *)local_5f8,0xa9);
  ut::are_not_equal<int,int>(&local_5a8,&local_5ac,&local_5d8);
  ut::LocationInfo::~LocationInfo(&local_5d8);
  std::__cxx11::string::~string(local_5f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5f9);
  local_600 = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,2);
  local_604 = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_650,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,(allocator *)&r3.field_0x2f);
  ut::LocationInfo::LocationInfo(&local_630,(string *)local_650,0xaa);
  ut::are_equal<int,int>(&local_600,&local_604,&local_630);
  ut::LocationInfo::~LocationInfo(&local_630);
  std::__cxx11::string::~string(local_650);
  std::allocator<char>::~allocator((allocator<char> *)&r3.field_0x2f);
  renderer_parallel::renderer_parallel((renderer_parallel *)local_688,5);
  local_690 = zero::operator_cast_to_agge_vector(&local_691);
  renderer_parallel::operator()
            ((renderer_parallel *)local_688,(bitmap<unsigned_short,_0UL,_0UL> *)local_170,local_690,
             (rect_i *)0x0,(mask_full<8UL> *)&bitmap._width,
             (thread_mapping_blender<unsigned_short,_unsigned_char> *)&r1._parallelism,&local_692);
  local_698 = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,0);
  local_69c = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_6e8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,&local_6e9);
  ut::LocationInfo::LocationInfo(&local_6c8,(string *)local_6e8,0xb1);
  ut::are_equal<int,int>(&local_698,&local_69c,&local_6c8);
  ut::LocationInfo::~LocationInfo(&local_6c8);
  std::__cxx11::string::~string(local_6e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
  local_6f0 = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,0);
  local_6f4 = (anonymous_namespace)::
              get_scanline_thread<unsigned_char,agge::tests::mocks::bitmap<unsigned_short,0ul,0ul>>
                        ((bitmap<unsigned_short,_0UL,_0UL> *)local_170,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_740,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,&local_741);
  ut::LocationInfo::LocationInfo(&local_720,(string *)local_740,0xb2);
  ut::are_not_equal<int,int>(&local_6f0,&local_6f4,&local_720);
  ut::LocationInfo::~LocationInfo(&local_720);
  std::__cxx11::string::~string(local_740);
  std::allocator<char>::~allocator((allocator<char> *)&local_741);
  renderer_parallel::~renderer_parallel((renderer_parallel *)local_688);
  renderer_parallel::~renderer_parallel((renderer_parallel *)local_438);
  renderer_parallel::~renderer_parallel((renderer_parallel *)local_240);
  mutex::~mutex((mutex *)((long)&blender._mtx + 4));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(mtx._buffer + 0x5c));
  tests::mocks::bitmap<unsigned_short,_0UL,_0UL>::~bitmap
            ((bitmap<unsigned_short,_0UL,_0UL> *)local_170);
  tests::mocks::mask_full<8UL>::~mask_full((mask_full<8UL> *)&bitmap._width);
  return;
}

Assistant:

test( RowsAreProcessedInInterlacedOrderInDedicatedThreads )
			{
				// INIT
				const mocks::cell cells1[] = { { 0, 0, 0x10 }, { 3, 0, -0x10 }, };
				const mocks::cell cells2[] = { { 1, 0, 0x10 }, { 4, 0, -0x10 }, };
				const mocks::cell cells3[] = { { 2, 0, 0x10 }, { 5, 0, -0x10 }, };
				const mocks::cell cells4[] = { { 1, 0, 0x10 }, { 4, 0, -0x10 }, };
				const mocks::cell cells5[] = { { 0, 0, 0x10 }, { 3, 0, -0x10 }, };
				const mocks::cell cells6[] = { { 1, 0, 0x10 }, { 4, 0, -0x10 }, };
				mocks::mask<8>::scanline_cells cells[] = {
					make_pair(begin(cells1), end(cells1)),
					make_pair(begin(cells2), end(cells2)),
					make_pair(begin(cells3), end(cells3)),
					make_pair(begin(cells4), end(cells4)),
					make_pair(begin(cells5), end(cells5)),
					make_pair(begin(cells6), end(cells6)),
				};
				mocks::mask_full<8> mask(cells, 0);
				mocks::bitmap<uint16_t> bitmap(5, 6);
				thread_mapping mapping;
				mutex mtx;
				mocks::thread_mapping_blender<uint16_t, uint8_t> blender(mapping, mtx);

				// ACT
				renderer_parallel r1(2);
				r1(bitmap, zero(), 0, mask, blender, mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 2));
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 4));

				assert_not_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 1));
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 1), get_scanline_thread<uint8_t>(bitmap, 3));
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 1), get_scanline_thread<uint8_t>(bitmap, 5));

				// ACT
				renderer_parallel r2(3);
				r2(bitmap, zero(), 0, mask, blender, mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 3));

				assert_not_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 1));
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 1), get_scanline_thread<uint8_t>(bitmap, 4));

				assert_not_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 2));
				assert_not_equal(get_scanline_thread<uint8_t>(bitmap, 1), get_scanline_thread<uint8_t>(bitmap, 2));
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 2), get_scanline_thread<uint8_t>(bitmap, 5));

				// ACT
				renderer_parallel r3(5);
				r3(bitmap, zero(), 0, mask, blender, mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				assert_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 5));
				assert_not_equal(get_scanline_thread<uint8_t>(bitmap, 0), get_scanline_thread<uint8_t>(bitmap, 1));
			}